

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Param::Param(Param *this,Generator *m,string *name,Enum *enum_def)

{
  uint32_t width;
  Enum *enum_def_local;
  string *name_local;
  Generator *m_local;
  Param *this_local;
  
  width = Enum::width(enum_def);
  Const::Const(&this->super_Const,m,0,width,false);
  (this->super_Const).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005a3c90;
  std::__cxx11::string::string((string *)&this->parameter_name_,(string *)name);
  this->param_type_ = Enum;
  std::
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  ::unordered_set(&this->param_vars_width_);
  std::
  set<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
  ::set(&this->param_vars_size_);
  std::
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  ::unordered_set(&this->param_params_);
  this->parent_param_ = (Param *)0x0;
  this->has_value_ = false;
  std::optional<long>::optional(&this->initial_value_);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->raw_str_value_);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->initial_raw_str_value_);
  this->enum_def_ = enum_def;
  (this->super_Const).super_Var.type_ = Parameter;
  return;
}

Assistant:

Param::Param(Generator *m, std::string name, Enum *enum_def)
    : Const(m, 0, enum_def->width(), false),
      parameter_name_(std::move(name)),
      param_type_(ParamType::Enum),
      enum_def_(enum_def) {
    type_ = VarType::Parameter;
}